

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O3

char * choc::text::FloatToStringBuffer<float>::writeWithoutExponentLessThan1
                 (char *dest,uint32_t length,int mantissaDigits,int maxDecimalPlaces)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = -(mantissaDigits + -2);
  memmove(dest + uVar3,dest,(ulong)length);
  if (mantissaDigits != 2) {
    memset(dest,0x30,(ulong)uVar3);
  }
  dest[1] = '.';
  if (mantissaDigits + maxDecimalPlaces < (int)length) {
    if (1 < maxDecimalPlaces) {
      uVar2 = (ulong)(maxDecimalPlaces + 2);
      do {
        uVar3 = (int)uVar2 - 1;
        uVar2 = (ulong)uVar3;
        if (dest[uVar2] != '0') {
          return dest + uVar2 + 1;
        }
      } while (3 < (int)uVar3);
    }
    pcVar1 = dest + 3;
  }
  else {
    uVar2 = (ulong)(uVar3 + length);
    do {
      uVar4 = uVar2 - 1;
      if (uVar2 < 4) break;
      uVar2 = uVar4;
    } while (dest[uVar4 & 0xffffffff] == '0');
    pcVar1 = dest + ((int)uVar4 + 1);
  }
  return pcVar1;
}

Assistant:

static char* writeWithoutExponentLessThan1 (char* dest, uint32_t length, int mantissaDigits, int maxDecimalPlaces)
    {
        auto numPaddingZeros = static_cast<uint32_t> (2 - mantissaDigits);
        insertChar (dest, length, '0', numPaddingZeros);
        dest[1] = '.';

        if (static_cast<int> (length) > maxDecimalPlaces + mantissaDigits)
        {
            for (int i = maxDecimalPlaces + 1; i > 2; --i)
                if (dest[i] != '0')
                    return dest + (i + 1);

            return dest + 3;
        }

        length += numPaddingZeros;

        while (dest[length - 1] == '0' && length > 3)
            --length;

        return dest + length;
    }